

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib597.c
# Opt level: O0

int test(char *URL)

{
  FILE *pFVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  uint *puVar6;
  char *pcVar7;
  timeval tVar8;
  timeval older;
  timeval older_00;
  CURLMcode ec_12;
  int ec_11;
  CURLMcode ec_10;
  CURLMcode ec_9;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  uint local_20c;
  CURLMcode ec_8;
  int maxfd;
  long timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval interval;
  CURLMcode ec_7;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_48;
  CURLMsg *msg;
  int phase;
  int msgs_left;
  int running;
  int res;
  CURLM *multi;
  CURL *easy;
  char *URL_local;
  
  multi = (CURLM *)0x0;
  _running = 0;
  msgs_left = 0;
  easy = URL;
  tVar8 = tutil_tvnow();
  _ec_1 = tVar8.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_48 = tVar8.tv_usec;
  tv_test_start.tv_usec = local_48;
  uVar2 = curl_global_init(3);
  pFVar1 = _stderr;
  if (uVar2 != 0) {
    uVar4 = curl_easy_strerror(uVar2);
    fprintf(pFVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
            ,0x3b,(ulong)uVar2,uVar4);
    msgs_left = uVar2;
  }
  if (msgs_left == 0) {
    multi = (CURLM *)curl_easy_init();
    if (multi == (CURLM *)0x0) {
      fprintf(_stderr,"%s:%d curl_easy_init() failed\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
              ,0x40);
      msgs_left = 0x7c;
    }
    if (msgs_left == 0) {
      _running = curl_multi_init();
      if (_running == 0) {
        fprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                ,0x42);
        msgs_left = 0x7b;
      }
      if (msgs_left == 0) {
        for (msg._0_4_ = 0; (int)msg < 2; msg._0_4_ = (int)msg + 1) {
          uVar2 = curl_easy_setopt(multi,0x29,1);
          pFVar1 = _stderr;
          if (uVar2 != 0) {
            uVar4 = curl_easy_strerror(uVar2);
            fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                    ,0x46,(ulong)uVar2,uVar4);
            msgs_left = uVar2;
          }
          if (msgs_left != 0) break;
          uVar2 = curl_easy_setopt(multi,0x2712,easy);
          pFVar1 = _stderr;
          if (uVar2 != 0) {
            uVar4 = curl_easy_strerror(uVar2);
            fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                    ,0x49,(ulong)uVar2,uVar4);
            msgs_left = uVar2;
          }
          if (msgs_left != 0) break;
          if ((int)msg == 0) {
            uVar2 = curl_easy_setopt(multi,0x8d,1);
            pFVar1 = _stderr;
            if (uVar2 != 0) {
              uVar4 = curl_easy_strerror(uVar2);
              fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                      ,0x4d,(ulong)uVar2,uVar4);
              msgs_left = uVar2;
            }
            if (msgs_left != 0) break;
          }
          if ((int)msg == 1) {
            uVar2 = curl_easy_setopt(multi,0x8d,0);
            pFVar1 = _stderr;
            if (uVar2 != 0) {
              uVar4 = curl_easy_strerror(uVar2);
              fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                      ,0x51,(ulong)uVar2,uVar4);
              msgs_left = uVar2;
            }
            if (msgs_left != 0) break;
            uVar2 = curl_easy_setopt(multi,0x2c,1);
            pFVar1 = _stderr;
            if (uVar2 != 0) {
              uVar4 = curl_easy_strerror(uVar2);
              fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                      ,0x52,(ulong)uVar2,uVar4);
              msgs_left = uVar2;
            }
            if (msgs_left != 0) break;
            uVar2 = curl_easy_setopt(multi,0x4b,1);
            pFVar1 = _stderr;
            if (uVar2 != 0) {
              uVar4 = curl_easy_strerror(uVar2);
              fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                      ,0x53,(ulong)uVar2,uVar4);
              msgs_left = uVar2;
            }
            if (msgs_left != 0) break;
          }
          uVar2 = curl_multi_add_handle(_running,multi);
          pFVar1 = _stderr;
          if (uVar2 != 0) {
            uVar4 = curl_multi_strerror(uVar2);
            fprintf(pFVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                    ,0x56,(ulong)uVar2,uVar4);
            msgs_left = uVar2;
          }
          while( true ) {
            if (msgs_left != 0) goto LAB_00102db5;
            _ec_8 = -99;
            local_20c = 0xffffff9d;
            uVar2 = curl_multi_perform(_running,&phase);
            pFVar1 = _stderr;
            if (uVar2 == 0) {
              if (phase < 0) {
                fprintf(_stderr,
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                        ,0x60,(ulong)(uint)phase);
                msgs_left = 0x7a;
              }
            }
            else {
              uVar4 = curl_multi_strerror(uVar2);
              fprintf(pFVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                      ,0x60,(ulong)uVar2,uVar4);
              msgs_left = uVar2;
            }
            if (msgs_left != 0) goto LAB_00102db5;
            tVar8 = tutil_tvnow();
            older.tv_usec = tv_test_start.tv_usec;
            older.tv_sec = tv_test_start.tv_sec;
            lVar5 = tutil_tvdiff(tVar8,older);
            if (5000 < lVar5) {
              fprintf(_stderr,
                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                      ,0x62);
              msgs_left = 0x7d;
            }
            if (msgs_left != 0) goto LAB_00102db5;
            if (phase == 0) break;
            for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
              fdwrite.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
            }
            for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
              fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
            }
            for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
              fdexcep.__fds_bits[(ulong)__arr_2._4_4_ - 1] = 0;
            }
            uVar2 = curl_multi_fdset(_running,fdwrite.__fds_bits + 0xf,fdexcep.__fds_bits + 0xf,
                                     &timeout,&local_20c);
            pFVar1 = _stderr;
            if (uVar2 == 0) {
              if ((int)local_20c < -1) {
                fprintf(_stderr,
                        "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                        ,0x6b,(ulong)local_20c);
                msgs_left = 0x7a;
              }
            }
            else {
              uVar4 = curl_multi_strerror(uVar2);
              fprintf(pFVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                      ,0x6b,(ulong)uVar2,uVar4);
              msgs_left = uVar2;
            }
            if (msgs_left != 0) goto LAB_00102db5;
            uVar2 = curl_multi_timeout(_running,&ec_8);
            pFVar1 = _stderr;
            if (uVar2 == 0) {
              if (_ec_8 < -1) {
                fprintf(_stderr,
                        "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                        ,0x6f,_ec_8);
                msgs_left = 0x73;
              }
            }
            else {
              uVar4 = curl_multi_strerror(uVar2);
              fprintf(pFVar1,"%s:%d curl_multi_timeout() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                      ,0x6f,(ulong)uVar2,uVar4);
              msgs_left = uVar2;
            }
            if (msgs_left != 0) goto LAB_00102db5;
            if (_ec_8 == -1) {
              fdread.__fds_bits[0xf] = 6;
            }
            else {
              fdread.__fds_bits[0xf] = _ec_8 / 1000;
            }
            iVar3 = select_wrapper(local_20c + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                                   (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)&timeout,
                                   (timeval *)(fdread.__fds_bits + 0xf));
            if (iVar3 == -1) {
              puVar6 = (uint *)__errno_location();
              pFVar1 = _stderr;
              uVar2 = *puVar6;
              pcVar7 = strerror(uVar2);
              fprintf(pFVar1,"%s:%d select() failed, with errno %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                      ,0x7c,(ulong)uVar2,pcVar7);
              msgs_left = 0x79;
            }
            if (msgs_left != 0) goto LAB_00102db5;
            tVar8 = tutil_tvnow();
            older_00.tv_usec = tv_test_start.tv_usec;
            older_00.tv_sec = tv_test_start.tv_sec;
            lVar5 = tutil_tvdiff(tVar8,older_00);
            if (5000 < lVar5) {
              fprintf(_stderr,
                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                      ,0x7e);
              msgs_left = 0x7d;
            }
          }
          lVar5 = curl_multi_info_read(_running,(long)&msg + 4);
          if (lVar5 != 0) {
            msgs_left = *(int *)(lVar5 + 0x10);
          }
          uVar2 = curl_multi_remove_handle(_running,multi);
          pFVar1 = _stderr;
          if (uVar2 != 0) {
            uVar4 = curl_multi_strerror(uVar2);
            fprintf(pFVar1,"%s:%d curl_multi_remove_handle() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                    ,0x85,(ulong)uVar2,uVar4);
            msgs_left = uVar2;
          }
          if (msgs_left != 0) break;
        }
      }
    }
LAB_00102db5:
    curl_multi_cleanup(_running);
    curl_easy_cleanup(multi);
    curl_global_cleanup();
    URL_local._4_4_ = msgs_left;
  }
  else {
    URL_local._4_4_ = msgs_left;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURLM *multi = NULL;
  int res = 0;
  int running;
  int msgs_left;
  int phase;
  CURLMsg *msg;

  start_test_timing();

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    return res;
  }

  easy_init(easy);

  multi_init(multi);

  for (phase = CONNECT_ONLY_PHASE; phase < LAST_PHASE; ++phase) {
    /* go verbose */
    easy_setopt(easy, CURLOPT_VERBOSE, 1L);

    /* specify target */
    easy_setopt(easy, CURLOPT_URL, URL);

    /* enable 'CONNECT_ONLY' option when in connect phase */
    if (phase == CONNECT_ONLY_PHASE)
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 1L);

    /* enable 'NOBODY' option to send 'QUIT' command in quit phase */
    if (phase == QUIT_PHASE) {
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 0L);
      easy_setopt(easy, CURLOPT_NOBODY, 1L);
      easy_setopt(easy, CURLOPT_FORBID_REUSE, 1L);
    }

    multi_add_handle(multi, easy);

    for(;;) {
      struct timeval interval;
      fd_set fdread;
      fd_set fdwrite;
      fd_set fdexcep;
      long timeout = -99;
      int maxfd = -99;

      multi_perform(multi, &running);

      abort_on_test_timeout();

      if(!running)
        break; /* done */

      FD_ZERO(&fdread);
      FD_ZERO(&fdwrite);
      FD_ZERO(&fdexcep);

      multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

      /* At this point, maxfd is guaranteed to be greater or equal than -1. */

      multi_timeout(multi, &timeout);

      /* At this point, timeout is guaranteed to be greater or equal than -1. */

      if(timeout != -1L) {
        interval.tv_sec = timeout/1000;
        interval.tv_usec = (timeout%1000)*1000;
      }
      else {
        interval.tv_sec = TEST_HANG_TIMEOUT/1000+1;
        interval.tv_usec = 0;
      }

      select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);

      abort_on_test_timeout();
    }

    msg = curl_multi_info_read(multi, &msgs_left);
    if(msg)
      res = msg->data.result;

    multi_remove_handle(multi, easy);
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  return res;
}